

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

PipelineResourceDesc * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,Uint32 ResIndex)

{
  char (*in_RCX) [37];
  string msg;
  string local_38;
  
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[37]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < this->m_Desc.NumResources",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x2b7);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (this->
         super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
         ).m_Desc.Resources + ResIndex;
}

Assistant:

const PipelineResourceDesc& GetResourceDesc(Uint32 ResIndex) const
    {
        VERIFY_EXPR(ResIndex < this->m_Desc.NumResources);
        return this->m_Desc.Resources[ResIndex];
    }